

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O2

void __thiscall
hbm::streaming::StreamClient::subscribe(StreamClient *this,signalReferences_t *signalReferences)

{
  Controller controller;
  allocator local_b1;
  string local_b0;
  Controller local_90;
  
  std::__cxx11::string::string((string *)&local_b0,(this->m_address)._M_dataplus._M_p,&local_b1);
  Controller::Controller
            (&local_90,&this->m_streamId,&local_b0,&this->m_controlPort,&this->m_httpPath);
  std::__cxx11::string::~string((string *)&local_b0);
  Controller::subscribe(&local_90,signalReferences);
  Controller::~Controller(&local_90);
  return;
}

Assistant:

void StreamClient::subscribe(const signalReferences_t& signalReferences)
		{
			Controller controller(m_streamId, m_address.c_str(), m_controlPort, m_httpPath);
			controller.subscribe(signalReferences);
		}